

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O0

void __thiscall
ASCFile::parse_format
          (ASCFile *this,char **p,char **s,char **arena,char **arena_end,line_iterator_t *line_it)

{
  char **in_RSI;
  long in_RDI;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *in_R9;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *this_00;
  value_type *__x;
  double y;
  double x;
  BRDPoint point;
  BRDPoint local_38 [5];
  char **local_10;
  
  if ((*(byte *)(in_RDI + 0xc0) & 1) == 0) {
    local_10 = in_RSI;
    BRDPoint::BRDPoint(local_38);
    this_00 = (vector<BRDPoint,_std::allocator<BRDPoint>_> *)strtod(*local_10,local_10);
    local_38[0].x = (int)((double)this_00 * 1000.0);
    __x = (value_type *)strtod(*local_10,local_10);
    local_38[0].y = (int)((double)__x * 1000.0);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back(this_00,__x);
  }
  else {
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator+=
              (in_R9,7);
    *(undefined1 *)(in_RDI + 0xc0) = 0;
  }
  return;
}

Assistant:

void ASCFile::parse_format(char *&p, char *&s, char *&arena, char *&arena_end, line_iterator_t &line_it) {
	if (m_firstformat) {
		line_it += 7; // Skip 7+1 unused lines before 1st point. Might not work with all files.
		m_firstformat = false;
		return; // lines++ in while loop
	}
	BRDPoint point;

	double x = READ_DOUBLE();
	point.x  = x * 1000.0f; // OBV uses integers
	double y = READ_DOUBLE();
	point.y  = y * 1000.0f;
	format.push_back(point);
}